

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# common.c
# Opt level: O3

void ly_err_free(void *ptr)

{
  void *pvVar1;
  ly_err_item *i;
  
  if (ptr != (void *)0x0) {
    do {
      pvVar1 = *(void **)((long)ptr + 0x28);
      free(*(void **)((long)ptr + 0x10));
      free(*(void **)((long)ptr + 0x18));
      free(*(void **)((long)ptr + 0x20));
      free(ptr);
      ptr = pvVar1;
    } while (pvVar1 != (void *)0x0);
  }
  return;
}

Assistant:

void
ly_err_free(void *ptr)
{
    struct ly_err_item *i, *next;

    /* clean the error list */
    for (i = (struct ly_err_item *)ptr; i; i = next) {
        next = i->next;
        free(i->msg);
        free(i->path);
        free(i->apptag);
        free(i);
    }
}